

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_Tt8Isop(word *uOn,word *uOnDc,int nVars,word *uRes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  word wVar4;
  word *pwVar5;
  ulong uVar6;
  ulong uVar7;
  word uRes0 [2];
  word uOnDc2 [2];
  word uRes2 [2];
  word uRes1 [2];
  word uOn1 [2];
  word uOn0 [2];
  int local_d4;
  word *local_d0;
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  word *local_98;
  ulong local_90;
  ulong local_88;
  ulong uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  
  local_d4 = 0;
  if (nVars < 7) {
    wVar4 = Abc_Tt6Isop(*uOn,*uOnDc,nVars,&local_d4);
    uRes[3] = wVar4;
    uRes[2] = wVar4;
    uRes[1] = wVar4;
    *uRes = wVar4;
  }
  else {
    pwVar5 = uRes;
    if (nVars != 7) {
      if ((((*uOn != uOn[2]) || (uOn[1] != uOn[3])) || (*uOnDc != uOnDc[2])) ||
         (pwVar5 = (word *)uOnDc[1], pwVar5 != (word *)uOnDc[3])) {
        if (nVars != 8) {
          __assert_fail("nVars == 8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                        ,0x746,"int Abc_Tt8Isop(word *, word *, int, word *)");
        }
        local_d0 = uOnDc + 2;
        local_48 = *uOn & ~uOnDc[2];
        local_40 = ~uOnDc[3] & uOn[1];
        pwVar5 = (word *)(uOnDc[2] & *uOnDc);
        local_58 = uOn[2] & ~*uOnDc;
        local_50 = ~uOnDc[1] & uOn[3];
        local_90 = uOnDc[1] & uOnDc[3];
        local_98 = pwVar5;
        iVar1 = Abc_Tt7Isop(&local_48,uOnDc,(int)&local_a8,pwVar5);
        iVar2 = Abc_Tt7Isop(&local_58,local_d0,(int)&local_78,pwVar5);
        local_c8 = local_a8;
        uStack_c4 = uStack_a4;
        uStack_c0 = uStack_a0;
        uStack_bc = uStack_9c;
        local_b8 = local_78;
        uStack_b4 = uStack_74;
        uStack_b0 = uStack_70;
        uStack_ac = uStack_6c;
        local_68 = ~local_78 & (uint)uOn[2] | ~local_a8 & (uint)*uOn;
        uStack_64 = ~uStack_74 & *(uint *)((long)uOn + 0x14) | ~uStack_a4 & *(uint *)((long)uOn + 4)
        ;
        uStack_60 = ~uStack_70 & (uint)uOn[3] | ~uStack_a0 & (uint)uOn[1];
        uStack_5c = ~uStack_6c & *(uint *)((long)uOn + 0x1c) |
                    ~uStack_9c & *(uint *)((long)uOn + 0xc);
        iVar3 = Abc_Tt7Isop((word *)&local_68,(word *)&local_98,(int)&local_88,pwVar5);
        uVar6 = CONCAT44(uStack_c4,local_c8) | local_88;
        uVar7 = CONCAT44(uStack_bc,uStack_c0) | uStack_80;
        local_88 = local_88 | CONCAT44(uStack_b4,local_b8);
        uStack_80 = uStack_80 | CONCAT44(uStack_ac,uStack_b0);
        uRes[2] = local_88;
        uRes[3] = uStack_80;
        *uRes = uVar6;
        uRes[1] = uVar7;
        if ((((*uOn & ~uVar6) == 0) && ((uOn[1] & ~uVar7) == 0)) &&
           (((uOn[2] & ~local_88) == 0 && ((uOn[3] & ~uStack_80) == 0)))) {
          if ((((uVar6 & ~*uOnDc) == 0) && ((uVar7 & ~uOnDc[1]) == 0)) &&
             (((local_88 & ~*local_d0) == 0 && ((uStack_80 & ~uOnDc[3]) == 0)))) {
            return iVar1 + iVar2 + iVar3;
          }
          __assert_fail("(uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0 && (uRes[2] & ~uOnDc[2])==0 && (uRes[3] & ~uOnDc[3])==0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                        ,0x75a,"int Abc_Tt8Isop(word *, word *, int, word *)");
        }
        __assert_fail("(uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0 && (uOn[2] & ~uRes[2]) == 0 && (uOn[3] & ~uRes[3]) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                      ,0x759,"int Abc_Tt8Isop(word *, word *, int, word *)");
      }
    }
    local_d4 = Abc_Tt7Isop(uOn,uOnDc,(int)uRes,pwVar5);
    uRes[2] = *uRes;
    uRes[3] = uRes[1];
  }
  return local_d4;
}

Assistant:

static inline int Abc_Tt8Isop( word uOn[4], word uOnDc[4], int nVars, word uRes[4] )
{
    int nCubes = 0;
    if ( nVars <= 6 )
        uRes[0] = uRes[1] = uRes[2] = uRes[3] = Abc_Tt6Isop( uOn[0], uOnDc[0], nVars, &nCubes );
    else if ( nVars == 7 || (uOn[0] == uOn[2] && uOn[1] == uOn[3] && uOnDc[0] == uOnDc[2] && uOnDc[1] == uOnDc[3]) )
    {
        nCubes = Abc_Tt7Isop( uOn, uOnDc, 7, uRes );
        uRes[2] = uRes[0];
        uRes[3] = uRes[1];
    }
    else 
    {
        word uOn0[2], uOn1[2], uOn2[2], uOnDc2[2], uRes0[2], uRes1[2], uRes2[2];
        assert( nVars == 8 );
        // cofactor
        uOn0[0] = uOn[0] & ~uOnDc[2];
        uOn0[1] = uOn[1] & ~uOnDc[3];
        uOn1[0] = uOn[2] & ~uOnDc[0];
        uOn1[1] = uOn[3] & ~uOnDc[1];
        uOnDc2[0] = uOnDc[0] & uOnDc[2];
        uOnDc2[1] = uOnDc[1] & uOnDc[3];
        // solve for cofactors
        nCubes += Abc_Tt7Isop( uOn0, uOnDc+0, 7, uRes0 );
        nCubes += Abc_Tt7Isop( uOn1, uOnDc+2, 7, uRes1 );
        uOn2[0] = (uOn[0] & ~uRes0[0]) | (uOn[2] & ~uRes1[0]);
        uOn2[1] = (uOn[1] & ~uRes0[1]) | (uOn[3] & ~uRes1[1]);
        nCubes += Abc_Tt7Isop( uOn2, uOnDc2, 7, uRes2 );
        // derive the final truth table
        uRes[0] = uRes2[0] | uRes0[0];
        uRes[1] = uRes2[1] | uRes0[1];
        uRes[2] = uRes2[0] | uRes1[0];
        uRes[3] = uRes2[1] | uRes1[1];
        assert( (uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0 && (uOn[2] & ~uRes[2]) == 0 && (uOn[3] & ~uRes[3]) == 0 );
        assert( (uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0 && (uRes[2] & ~uOnDc[2])==0 && (uRes[3] & ~uOnDc[3])==0 );
    }
    return nCubes;
}